

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_arkstep.c
# Opt level: O3

int arkStep_StageSetup(ARKodeMem ark_mem,int implicit)

{
  uint uVar1;
  ARKodeARKStepMem step_mem;
  sunrealtype *psVar2;
  N_Vector p_Var3;
  long lVar4;
  int iVar5;
  int iVar6;
  long lVar7;
  uint jmax;
  ulong uVar9;
  sunrealtype *stage_coefs;
  sunrealtype *stage_times;
  long lVar10;
  double dVar11;
  sunrealtype sVar12;
  int local_44;
  N_Vector *local_40;
  sunrealtype *local_38;
  uint uVar8;
  
  step_mem = (ARKodeARKStepMem)ark_mem->step_mem;
  if (step_mem == (ARKodeARKStepMem)0x0) {
    iVar6 = -0x15;
    arkProcessError((ARKodeMem)0x0,-0x15,0xab7,"arkStep_StageSetup",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/opencor[P]sundials/src/arkode/arkode_arkstep.c"
                    ,"Time step module memory is NULL.");
  }
  else {
    uVar1 = step_mem->istage;
    lVar10 = (long)(int)uVar1;
    psVar2 = step_mem->cvals;
    local_40 = step_mem->Xvecs;
    local_38 = psVar2;
    if (implicit == 0) {
      local_44 = 0;
      iVar6 = 0;
    }
    else {
      dVar11 = ark_mem->h * step_mem->Bi->A[lVar10][lVar10];
      step_mem->gamma = dVar11;
      if (ark_mem->firststage == 0) {
        sVar12 = dVar11 / step_mem->gammap;
      }
      else {
        step_mem->gammap = dVar11;
        sVar12 = 1.0;
      }
      step_mem->gamrat = sVar12;
      N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,ark_mem->yn,step_mem->zpred,step_mem->sdata
                  );
      *psVar2 = 1.0;
      p_Var3 = step_mem->sdata;
      *local_40 = p_Var3;
      local_44 = 1;
      iVar6 = 1;
      if (step_mem->mass_type == 1) {
        N_VScale(0x3ff0000000000000,p_Var3,ark_mem->tempv1);
        iVar5 = (*step_mem->mmult)(ark_mem,ark_mem->tempv1,step_mem->sdata);
        if (iVar5 != 0) {
          return -0x12;
        }
      }
    }
    psVar2 = local_38;
    if ((step_mem->explicit != 0) && (local_44 = iVar6, 0 < (int)uVar1)) {
      uVar9 = 0;
      do {
        *(double *)((long)local_38 + uVar9 * 8 + (ulong)(uint)(iVar6 << 3)) =
             ark_mem->h * step_mem->Be->A[uVar1][uVar9];
        *(N_Vector *)((long)local_40 + uVar9 * 8 + (ulong)(uint)(iVar6 << 3)) = step_mem->Fe[uVar9];
        uVar9 = uVar9 + 1;
      } while (uVar1 != uVar9);
      iVar6 = iVar6 + (int)uVar9;
      local_44 = iVar6;
    }
    if ((step_mem->implicit != 0) && (local_44 = iVar6, 0 < (int)uVar1)) {
      lVar7 = 0;
      do {
        local_38[iVar6 + lVar7] = ark_mem->h * step_mem->Bi->A[lVar10][lVar7];
        local_40[iVar6 + lVar7] = step_mem->Fi[lVar7];
        lVar7 = lVar7 + 1;
      } while (lVar10 != lVar7);
      iVar6 = iVar6 + (int)lVar7;
      local_44 = iVar6;
    }
    lVar7 = 0x68;
    if ((step_mem->expforcing != 0) || (lVar7 = 0x70, step_mem->impforcing != 0)) {
      uVar8 = (uint)(step_mem->expforcing == 0);
      jmax = uVar8 + uVar1;
      if (jmax == 0 || SCARRY4(uVar8,uVar1) != (int)jmax < 0) {
        stage_times = step_mem->stage_times;
        stage_coefs = step_mem->stage_coefs;
      }
      else {
        lVar7 = *(long *)((long)&step_mem->fe + lVar7);
        lVar4 = *(long *)(lVar7 + 0x18);
        stage_times = step_mem->stage_times;
        stage_coefs = step_mem->stage_coefs;
        lVar10 = *(long *)(*(long *)(lVar7 + 0x10) + lVar10 * 8);
        uVar9 = 0;
        do {
          stage_times[uVar9] = *(double *)(lVar4 + uVar9 * 8) * ark_mem->h + ark_mem->tn;
          stage_coefs[uVar9] = ark_mem->h * *(double *)(lVar10 + uVar9 * 8);
          uVar9 = uVar9 + 1;
        } while (jmax != uVar9);
      }
      arkStep_ApplyForcing(step_mem,stage_times,stage_coefs,jmax,&local_44);
      iVar6 = local_44;
    }
    iVar5 = N_VLinearCombination(iVar6,psVar2,local_40,step_mem->sdata);
    iVar6 = -0x1c;
    if (iVar5 == 0) {
      iVar6 = 0;
    }
  }
  return iVar6;
}

Assistant:

int arkStep_StageSetup(ARKodeMem ark_mem, sunbooleantype implicit)
{
  /* local data */
  ARKodeARKStepMem step_mem;
  int retval, i, j, jmax, nvec;
  sunrealtype* cj;
  sunrealtype** Aij;
  sunrealtype* cvals;
  N_Vector* Xvecs;

  /* access ARKodeARKStepMem structure */
  if (ark_mem->step_mem == NULL)
  {
    arkProcessError(NULL, ARK_MEM_NULL, __LINE__, __func__, __FILE__,
                    MSG_ARKSTEP_NO_MEM);
    return (ARK_MEM_NULL);
  }
  step_mem = (ARKodeARKStepMem)ark_mem->step_mem;

  /* Set shortcut to current stage index */
  i = step_mem->istage;

  /* local shortcuts for fused vector operations */
  cvals = step_mem->cvals;
  Xvecs = step_mem->Xvecs;

  /* Update gamma if stage is implicit */
  if (implicit)
  {
    step_mem->gamma = ark_mem->h * step_mem->Bi->A[i][i];
    if (ark_mem->firststage) { step_mem->gammap = step_mem->gamma; }
    step_mem->gamrat = (ark_mem->firststage)
                         ? ONE
                         : step_mem->gamma /
                             step_mem->gammap; /* protect x/x != 1.0 */
  }

  /* If implicit, initialize sdata to yn - zpred (here: zpred = zp), and set
     first entries for eventual N_VLinearCombination call */
  nvec = 0;
  if (implicit)
  {
    N_VLinearSum(ONE, ark_mem->yn, -ONE, step_mem->zpred, step_mem->sdata);
    cvals[0] = ONE;
    Xvecs[0] = step_mem->sdata;
    nvec     = 1;
  }

  /* If implicit with fixed M!=I, update sdata with M*sdata */
  if (implicit && (step_mem->mass_type == MASS_FIXED))
  {
    N_VScale(ONE, step_mem->sdata, ark_mem->tempv1);
    retval = step_mem->mmult((void*)ark_mem, ark_mem->tempv1, step_mem->sdata);
    if (retval != ARK_SUCCESS) { return (ARK_MASSMULT_FAIL); }
  }

  /* Update sdata with prior stage information */
  if (step_mem->explicit)
  { /* Explicit pieces */
    for (j = 0; j < i; j++)
    {
      cvals[nvec] = ark_mem->h * step_mem->Be->A[i][j];
      Xvecs[nvec] = step_mem->Fe[j];
      nvec += 1;
    }
  }
  if (step_mem->implicit)
  { /* Implicit pieces */
    for (j = 0; j < i; j++)
    {
      cvals[nvec] = ark_mem->h * step_mem->Bi->A[i][j];
      Xvecs[nvec] = step_mem->Fi[j];
      nvec += 1;
    }
  }

  /* apply external polynomial (MRI) forcing (M = I required) */
  if (step_mem->expforcing || step_mem->impforcing)
  {
    if (step_mem->expforcing)
    {
      jmax = i;
      Aij  = step_mem->Be->A;
      cj   = step_mem->Be->c;
    }
    else
    {
      jmax = i + 1;
      Aij  = step_mem->Bi->A;
      cj   = step_mem->Bi->c;
    }

    for (j = 0; j < jmax; j++)
    {
      step_mem->stage_times[j] = ark_mem->tn + cj[j] * ark_mem->h;
      step_mem->stage_coefs[j] = ark_mem->h * Aij[i][j];
    }

    arkStep_ApplyForcing(step_mem, step_mem->stage_times, step_mem->stage_coefs,
                         jmax, &nvec);
  }

  /* call fused vector operation to do the work */
  retval = N_VLinearCombination(nvec, cvals, Xvecs, step_mem->sdata);
  if (retval != 0) { return (ARK_VECTOROP_ERR); }

  /* return with success */
  return (ARK_SUCCESS);
}